

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::find(Value *this,char *key,char *cend)

{
  bool bVar1;
  reference ppVar2;
  iterator local_200;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_1f8;
  iterator local_1f0;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_1e8;
  const_iterator it;
  CZString actualKey;
  ostringstream local_1a0 [8];
  ostringstream oss;
  int local_28;
  char *cend_local;
  char *key_local;
  Value *this_local;
  
  if (((*(ushort *)&this->field_0x8 & 0xff) != 0) && ((*(ushort *)&this->field_0x8 & 0xff) != 7)) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::operator<<((ostream *)local_1a0,
                    "in Json::Value::find(key, end, found): requires objectValue or nullValue");
    std::__cxx11::ostringstream::str();
    throwLogicError((string *)&actualKey.field_1.storage_);
  }
  if ((*(ushort *)&this->field_0x8 & 0xff) == 0) {
    this_local = (Value *)0x0;
  }
  else {
    local_28 = (int)cend;
    CZString::CZString((CZString *)&it,key,local_28 - (int)key,noDuplication);
    local_1f0._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::find((this->value_).map_,(CZString *)&it);
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_1e8,&local_1f0);
    local_200._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::end((this->value_).map_);
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_1f8,&local_200);
    bVar1 = std::operator==(&local_1e8,&local_1f8);
    if (bVar1) {
      this_local = (Value *)0x0;
    }
    else {
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator*(&local_1e8);
      this_local = &ppVar2->second;
    }
    CZString::~CZString((CZString *)&it);
  }
  return this_local;
}

Assistant:

Value const* Value::find(char const* key, char const* cend) const
{
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == objectValue,
      "in Json::Value::find(key, end, found): requires objectValue or nullValue");
  if (type_ == nullValue) return NULL;
  CZString actualKey(key, static_cast<unsigned>(cend-key), CZString::noDuplication);
  ObjectValues::const_iterator it = value_.map_->find(actualKey);
  if (it == value_.map_->end()) return NULL;
  return &(*it).second;
}